

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindSuchRecord
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S)

{
  bool bVar1;
  RecordSet *pRVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  condition local_180;
  int local_118;
  byte local_111;
  int i;
  bool flag;
  int local_104;
  string local_100 [4];
  int Found;
  RecordSet *local_e0;
  RecordSet *RS;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [8];
  string filename;
  undefined1 local_88 [8];
  Record R;
  Addr p;
  STMT *S_local;
  RecordManager *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ans;
  
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  Record::Record((Record *)local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&RS,
                 &this->Direction);
  std::operator+(local_b8,(char *)&RS);
  std::__cxx11::string::~string((string *)&RS);
  std::__cxx11::string::string(local_100,(string *)local_b8);
  pRVar2 = FindRecordSet(this,(string *)local_100);
  std::__cxx11::string::~string(local_100);
  local_e0 = pRVar2;
  do {
    while( true ) {
      _i = R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_104 = RecordSet::FindRecord
                            (local_e0,(Addr)R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Record *)local_88);
      if (local_104 == -1) {
        std::__cxx11::string::~string((string *)local_b8);
        Record::~Record((Record *)local_88);
        return __return_storage_ptr__;
      }
      if (local_104 != 0) break;
      RecordSet::Addp(local_e0,(Addr *)&R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl
                                        .super__Vector_impl_data._M_end_of_storage);
    }
    local_111 = 1;
    for (local_118 = 0; uVar5 = (ulong)local_118,
        sVar3 = std::vector<condition,_std::allocator<condition>_>::size(S->c_list), uVar5 < sVar3;
        local_118 = local_118 + 1) {
      pvVar4 = std::vector<condition,_std::allocator<condition>_>::at(S->c_list,(long)local_118);
      condition::condition(&local_180,pvVar4);
      bVar1 = Record::Check((Record *)local_88,&local_180);
      condition::~condition(&local_180);
      if (!bVar1) {
        local_111 = 0;
        break;
      }
    }
    if ((local_111 & 1) == 1) {
      std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert
                (__return_storage_ptr__,
                 (value_type *)
                 &R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    RecordSet::Addp(local_e0,(Addr *)&R.KS.super__Vector_base<Keys,_std::allocator<Keys>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
  } while( true );
}

Assistant:

set<Addr> RecordManager::FindSuchRecord(STMT S) {
	set<Addr> ans;
	Addr p = { 1, 0 };
	Record R;
	string filename = Direction + S.tableName + "_rcd.dat";
	RecordSet& RS = this->FindRecordSet(filename);
	while (1) {
		int Found = RS.FindRecord(p, R);
		if (Found == -1)
			break;					//�Ѿ������¼�ļ�ĩβ�ˣ�����ѭ��
		if (Found == 0){
            RS.Addp(p);
            continue;
        }
		else {						//������¼��Ч�����������
			bool flag = true;
			int i;
			for (i = 0; i < S.c_list->size(); i++) {
				if (R.Check(S.c_list->at(i)) == false) {
					flag = false;	//����һ�����������㣬ֱ����̭
					break;
				}
			}
			if (flag == true) {
				ans.insert(p);		//�������������ģ������ַ������������
			}
		}
		RS.Addp(p);					//��ַ����
	}
	return ans;
}